

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> * __thiscall
cnn::Tensor::batch_elems(Tensor *this)

{
  uint uVar1;
  uint uVar2;
  Tensor *this_00;
  Dim *in_RSI;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_RDI;
  uint b;
  Dim new_d;
  uint bsize;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *bs;
  undefined4 in_stack_ffffffffffffff28;
  allocator_type *in_stack_ffffffffffffff38;
  Dim *d;
  Tensor *in_stack_ffffffffffffff40;
  value_type *__value;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *this_01;
  uint local_54;
  undefined1 local_50 [32];
  undefined4 local_30;
  uint local_2c;
  undefined1 local_26 [38];
  
  this_01 = in_RDI;
  uVar1 = Dim::batch_elems(in_RSI);
  if (uVar1 == 1) {
    __value = (value_type *)(local_26 + 0x15);
    std::allocator<cnn::Tensor>::allocator((allocator<cnn::Tensor> *)0x7b493d);
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (this_01,(size_type)in_RDI,__value,in_stack_ffffffffffffff38);
    std::allocator<cnn::Tensor>::~allocator((allocator<cnn::Tensor> *)0x7b4965);
  }
  else {
    local_26[1] = 0;
    uVar1 = Dim::batch_elems(in_RSI);
    this_00 = (Tensor *)(ulong)uVar1;
    d = (Dim *)local_26;
    std::allocator<cnn::Tensor>::allocator((allocator<cnn::Tensor> *)0x7b49bb);
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (this_01,(size_type)in_RDI,(allocator_type *)in_stack_ffffffffffffff40);
    std::allocator<cnn::Tensor>::~allocator((allocator<cnn::Tensor> *)0x7b49de);
    local_2c = Dim::batch_size(in_RSI);
    memcpy(local_50,in_RSI,0x24);
    local_30 = 1;
    Dim::batch_elems(in_RSI);
    local_54 = 0;
    while (uVar1 = local_54, uVar2 = Dim::batch_elems(in_RSI), uVar1 < uVar2) {
      Tensor(in_stack_ffffffffffffff40,d,(float *)this_00);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[](in_RDI,(ulong)local_54);
      operator=(this_00,(Tensor *)CONCAT44(uVar1,in_stack_ffffffffffffff28));
      ~Tensor((Tensor *)0x7b4af1);
      local_54 = local_54 + 1;
    }
  }
  return this_01;
}

Assistant:

std::vector<Tensor> batch_elems() const {
    if(d.batch_elems() == 1) {
      return std::vector<Tensor>(1, *this); 
    } else {
      std::vector<Tensor> bs(d.batch_elems());
      unsigned bsize = d.batch_size();
      Dim new_d = d; new_d.bd = 1;
      assert (d.batch_elems() >= 0);
      for(unsigned b = 0; b < d.batch_elems(); ++b)
        bs[b] = Tensor(new_d, v + bsize * b);
      return bs;
    }
  }